

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O3

string_view __thiscall slang::parsing::Token::valueText(Token *this)

{
  undefined1 auVar1 [16];
  size_t sVar2;
  char *pcVar3;
  string_view sVar4;
  
  if (this->kind == Identifier) {
    sVar4 = rawText(this);
    pcVar3 = sVar4._M_str;
    sVar2 = sVar4._M_len;
    if (sVar2 == 0) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = pcVar3;
      sVar4 = (string_view)(auVar1 << 0x40);
    }
    else if (*pcVar3 == '\\') {
      sVar4._M_str = (char *)((long)pcVar3 + 1);
      sVar4._M_len = (size_t)(sVar2 - 1);
    }
  }
  else if (this->kind == StringLiteral) {
    sVar4 = *(string_view *)(this->info + 1);
  }
  else {
    sVar4 = rawText(this);
  }
  return sVar4;
}

Assistant:

std::string_view Token::valueText() const {
    switch (kind) {
        case TokenKind::StringLiteral:
            return info->stringText();
        case TokenKind::Identifier: {
            std::string_view result = rawText();
            if (!result.empty() && result[0] == '\\')
                result = result.substr(1);
            return result;
        }
        default:
            return rawText();
    }
}